

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O3

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,AngleBasis *angleBasis)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_60;
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"AngleBasisName","");
  FileParse::
  Child<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Child(&local_40,&local_60,&angleBasis->name,0);
  FileParse::operator>>(node,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"AngleBasisBlock","");
  FileParse::
  Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>::Child
            ((Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
              *)&local_40,&local_60,&angleBasis->blocks,0);
  FileParse::operator>>
            (node,(Child<std::vector<BSDFData::AngleBasisBlock,_std::allocator<BSDFData::AngleBasisBlock>_>_>
                   *)&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.nodeNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::AngleBasis & angleBasis)
    {
        node >> FileParse::Child{"AngleBasisName", angleBasis.name};
        node >> FileParse::Child{"AngleBasisBlock", angleBasis.blocks};

        return node;
    }